

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  FileStream *this;
  Engine *this_00;
  IGlobalFunction *globalFunction;
  Object **args;
  ObjectInt *this_01;
  allocator local_61;
  string local_60;
  string local_40;
  
  this = (FileStream *)operator_new(0x10);
  FileStream::FileStream(this,"test.script");
  this_00 = (Engine *)operator_new(0x70);
  Engine::Engine(this_00);
  Engine::loadCurrentScript(this_00,(Stream *)this);
  operator_delete(this);
  std::__cxx11::string::string((string *)&local_40,"test",&local_61);
  uVar1 = Engine::getGlobalFunctionNameByString(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  globalFunction = (IGlobalFunction *)operator_new(8);
  globalFunction->_vptr_IGlobalFunction = (_func_int **)&PTR_execute_0010b818;
  Engine::setGlobalFunction(this_00,uVar1,globalFunction);
  Engine::executeCurrentScript(this_00);
  std::__cxx11::string::string((string *)&local_60,"myTestFunction",&local_61);
  uVar1 = Engine::getLocalFunctionNameByString(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  args = (Object **)operator_new__(8);
  this_01 = (ObjectInt *)operator_new(0x10);
  ObjectInt::ObjectInt(this_01,0x18894);
  *args = (Object *)this_01;
  Engine::executeLocalFunction(this_00,uVar1,args,1);
  Engine::~Engine(this_00);
  operator_delete(this_00);
  return 0;
}

Assistant:

int main() {
	Stream* stream = new FileStream("test.script");
	Engine* engine = new Engine();
	
	engine->loadCurrentScript(stream);
	delete stream;
	
	unsigned int testFunctionName = engine->getGlobalFunctionNameByString("test");
	if (testFunctionName == Engine::CANT_FIND) {
		//do something
	}
	engine->setGlobalFunction(testFunctionName, new TestFunction());
	
	engine->executeCurrentScript();
	unsigned int myTestFunctionName = engine->getLocalFunctionNameByString("myTestFunction");
	
	unsigned int argc = 1;
	Object** args = new Object*[argc];
	args[0] = new ObjectInt(100500);
	engine->executeLocalFunction(myTestFunctionName, args, argc);
	
	delete engine;
	return 0;
}